

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_global.h
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
lf::mesh::utils::
MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/lagr_fe_tests.cc:872:7)>
::operator()(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
            MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_lagr_fe_tests_cc:872:7)>
            *this,Entity *e,MatrixXd *local)

{
  long lVar1;
  int iVar2;
  dim_t dVar3;
  ulong uVar4;
  size_type __n;
  long *plVar5;
  Index IVar6;
  ColXpr local_320;
  Vector2d local_2e8;
  Scalar local_2d8;
  long local_2d0;
  long i;
  MatrixXd global_points;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  stringstream local_1b8 [8];
  stringstream ss;
  ostream local_1a8 [383];
  RefEl local_29;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_28;
  MatrixXd *local_local;
  Entity *e_local;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_lagr_fe_tests_cc:872:7)>
  *this_local;
  vector<double,_std::allocator<double>_> *result;
  
  local_28 = &local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
  local_local = (MatrixXd *)e;
  e_local = (Entity *)this;
  this_local = (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_lagr_fe_tests_cc:872:7)>
                *)__return_storage_ptr__;
  iVar2 = (*e->_vptr_Entity[4])();
  local_29.type_ = (RefElType)iVar2;
  dVar3 = lf::base::RefEl::Dimension(&local_29);
  uVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows(local_28);
  if (dVar3 == uVar4) {
    global_points.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
    _6_1_ = 0;
    std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
    __n = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols(local_28);
    std::vector<double,_std::allocator<double>_>::reserve(__return_storage_ptr__,__n);
    plVar5 = (long *)(*(code *)(local_local->
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                               m_storage.m_data[3])();
    (**(code **)(*plVar5 + 0x18))(&i,plVar5,local_28);
    local_2d0 = 0;
    while( true ) {
      lVar1 = local_2d0;
      IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols(local_28);
      if (IVar6 <= lVar1) break;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (&local_320,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&i,local_2d0);
      Eigen::Matrix<double,2,1,0,2,1>::
      Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                ((Matrix<double,2,1,0,2,1> *)&local_2e8,
                 (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
                 &local_320);
      local_2d8 = anon_class_1_0_00000001_for_f_::operator()
                            ((anon_class_1_0_00000001_for_f_ *)&this->field_0x8,&local_2e8);
      std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&local_2d8);
      local_2d0 = local_2d0 + 1;
    }
    global_points.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
    _6_1_ = 1;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)&i);
    if ((global_points.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_cols._6_1_ & 1) == 0) {
      std::vector<double,_std::allocator<double>_>::~vector(__return_storage_ptr__);
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,"mismatch between entity dimension and local.rows()");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"e.RefEl().Dimension() == local.rows()",&local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
             ,&local_211);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_1e8,&local_210,0x50,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"false",&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
             ,&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"",
             (allocator<char> *)
             ((long)&global_points.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_cols + 7));
  lf::base::AssertionFailed(&local_258,&local_280,0x50,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&global_points.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_cols + 7));
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  abort();
}

Assistant:

std::vector<F_return_type> operator()(const mesh::Entity& e,
                                        const Eigen::MatrixXd& local) const {
    LF_ASSERT_MSG(e.RefEl().Dimension() == local.rows(),
                  "mismatch between entity dimension and local.rows()");
    std::vector<F_return_type> result;
    result.reserve(local.cols());
    auto global_points = e.Geometry()->Global(local);
    for (long i = 0; i < local.cols(); ++i) {
      result.push_back(f_(global_points.col(i)));
    }
    return result;
  }